

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

void keccak_transform(uint64_t (*A) [5])

{
  ulong uVar1;
  uint64_t uVar2;
  long lVar3;
  uint local_104;
  uint local_100;
  uint y_2;
  uint x_3;
  uint y_1;
  uint x_2;
  uint y;
  uint64_t D;
  uint local_e0;
  uint x_1;
  uint x;
  uint round;
  anon_union_200_2_9472fc22 u;
  uint64_t (*A_local) [5];
  
  u.B[4][4] = (uint64_t)A;
  for (x_1 = 0; x_1 < 0x18; x_1 = x_1 + 1) {
    for (local_e0 = 0; local_e0 < 5; local_e0 = local_e0 + 1) {
      *(ulong *)(&x + (ulong)local_e0 * 2) =
           *(ulong *)(u.B[4][4] + (ulong)local_e0 * 0x28) ^
           *(ulong *)(u.B[4][4] + (ulong)local_e0 * 0x28 + 8) ^
           *(ulong *)(u.B[4][4] + (ulong)local_e0 * 0x28 + 0x10) ^
           *(ulong *)(u.B[4][4] + (ulong)local_e0 * 0x28 + 0x18) ^
           *(ulong *)(u.B[4][4] + (ulong)local_e0 * 0x28 + 0x20);
    }
    for (D._4_4_ = 0; D._4_4_ < 5; D._4_4_ = D._4_4_ + 1) {
      uVar2 = rol(*(uint64_t *)(&x + ((ulong)(D._4_4_ + 1) % 5) * 2),1);
      uVar1 = *(ulong *)(&x + ((ulong)(D._4_4_ + 4) % 5) * 2);
      for (y_1 = 0; y_1 < 5; y_1 = y_1 + 1) {
        lVar3 = u.B[4][4] + (ulong)D._4_4_ * 0x28;
        *(uint64_t *)(lVar3 + (ulong)y_1 * 8) = uVar2 ^ uVar1 ^ *(ulong *)(lVar3 + (ulong)y_1 * 8);
      }
    }
    for (x_3 = 0; x_3 < 5; x_3 = x_3 + 1) {
      for (y_2 = 0; y_2 < 5; y_2 = y_2 + 1) {
        uVar2 = rol(*(uint64_t *)(u.B[4][4] + (ulong)x_3 * 0x28 + (ulong)y_2 * 8),
                    rotation_counts[x_3][y_2]);
        *(uint64_t *)(&x + (ulong)y_2 * 10 + ((ulong)(x_3 * 2 + y_2 * 3) % 5) * 2) = uVar2;
      }
    }
    for (local_100 = 0; local_100 < 5; local_100 = local_100 + 1) {
      for (local_104 = 0; local_104 < 5; local_104 = local_104 + 1) {
        *(ulong *)(u.B[4][4] + (ulong)local_100 * 0x28 + (ulong)local_104 * 8) =
             *(ulong *)(&x + (ulong)local_100 * 10 + (ulong)local_104 * 2) ^
             *(ulong *)(&x + ((ulong)(local_100 + 2) % 5) * 10 + (ulong)local_104 * 2) &
             (*(ulong *)(&x + ((ulong)(local_100 + 1) % 5) * 10 + (ulong)local_104 * 2) ^
             0xffffffffffffffff);
      }
    }
    *(uint64_t *)u.B[4][4] = round_constants[x_1] ^ *(ulong *)u.B[4][4];
  }
  smemclr(&x,200);
  return;
}

Assistant:

static void keccak_transform(keccak_core_state A)
{
    union {
        uint64_t C[5];
        uint64_t B[5][5];
    } u;

    for (unsigned round = 0; round < NROUNDS; round++) {
        /* theta step */
        for (unsigned x = 0; x < 5; x++)
            u.C[x] = A[x][0] ^ A[x][1] ^ A[x][2] ^ A[x][3] ^ A[x][4];
        for (unsigned x = 0; x < 5; x++) {
            uint64_t D = rol(u.C[(x+1) % 5], 1) ^ u.C[(x+4) % 5];
            for (unsigned y = 0; y < 5; y++)
                A[x][y] ^= D;
        }

        /* rho and pi steps */
        for (unsigned x = 0; x < 5; x++)
            for (unsigned y = 0; y < 5; y++)
                u.B[y][(2*x+3*y) % 5] = rol(A[x][y], rotation_counts[x][y]);

        /* chi step */
        for (unsigned x = 0; x < 5; x++)
            for (unsigned y = 0; y < 5; y++)
                A[x][y] = u.B[x][y] ^ (u.B[(x+2)%5][y] & ~u.B[(x+1)%5][y]);

        /* iota step */
        A[0][0] ^= round_constants[round];
    }

    smemclr(&u, sizeof(u));
}